

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

uint32_t gpioDelay(uint32_t micros)

{
  uint32_t uVar1;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioDelay_cold_1();
  }
  if (libInitialised == '\0') {
    uVar1 = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioDelay_cold_2();
    }
  }
  else {
    uVar1 = systReg[1];
    if (micros < 0x65) {
      do {
      } while (systReg[1] - uVar1 <= micros);
    }
    else {
      gpioSleep(0,micros / 1000000,micros % 1000000);
    }
    uVar1 = systReg[1] - uVar1;
  }
  return uVar1;
}

Assistant:

uint32_t gpioDelay(uint32_t micros)
{
   uint32_t start;

   DBG(DBG_USER, "microseconds=%u", micros);

   CHECK_INITED;

   start = systReg[SYST_CLO];

   if (micros <= PI_MAX_BUSY_DELAY)
      while ((systReg[SYST_CLO] - start) <= micros);
   else
      gpioSleep(PI_TIME_RELATIVE, (micros/MILLION), (micros%MILLION));

   return (systReg[SYST_CLO] - start);
}